

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O0

void __thiscall JsrtDebuggerObjectScope::~JsrtDebuggerObjectScope(JsrtDebuggerObjectScope *this)

{
  JsrtDebuggerObjectScope *this_local;
  
  ~JsrtDebuggerObjectScope(this);
  operator_delete(this);
  return;
}

Assistant:

JsrtDebuggerObjectScope::~JsrtDebuggerObjectScope()
{
    if (this->objectDisplay != nullptr)
    {
        HeapDelete(this->objectDisplay);
        this->objectDisplay = nullptr;
    }

    if (this->walkerRef != nullptr)
    {
        HeapDelete(this->walkerRef);
        this->walkerRef = nullptr;
    }
}